

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O0

void __thiscall tcmalloc::CentralFreeList::ReleaseToSpans(CentralFreeList *this,void *object)

{
  Length LVar1;
  PageHeap *pPVar2;
  SizeMap *pSVar3;
  Span *span;
  PageID p;
  void *object_local;
  CentralFreeList *this_local;
  Number i2;
  Number i1;
  Span *local_10;
  
  pPVar2 = Static::pageheap();
  if (((ulong)object >> 0x30 == 0) &&
     ((pPVar2->pagemap_).root_[(ulong)object >> 0x1f] != (Leaf *)0x0)) {
    local_10 = (Span *)(pPVar2->pagemap_).root_[(ulong)object >> 0x1f]->values
                       [(ulong)object >> 0xd & 0x3ffff];
  }
  else {
    local_10 = (Span *)0x0;
  }
  if ((local_10->field_4).objects == (void *)0x0) {
    DLL_Remove(local_10);
    DLL_Prepend(&this->nonempty_,local_10);
  }
  this->counter_ = this->counter_ + 1;
  *(uint *)&local_10->field_0x28 =
       *(uint *)&local_10->field_0x28 & 0xffff0000 |
       (*(uint *)&local_10->field_0x28 & 0xffff) - 1 & 0xffff;
  if ((*(uint *)&local_10->field_0x28 & 0xffff) == 0) {
    LVar1 = local_10->length;
    pSVar3 = Static::sizemap();
    this->counter_ =
         this->counter_ -
         (LVar1 << 0xd) /
         (ulong)(long)pSVar3->class_to_size_[*(uint *)&local_10->field_0x28 >> 0x10 & 0xff];
    DLL_Remove(local_10);
    this->num_spans_ = this->num_spans_ - 1;
    SpinLock::Unlock(&this->lock_);
    pPVar2 = Static::pageheap();
    PageHeap::Delete(pPVar2,local_10);
    SpinLock::Lock(&this->lock_);
  }
  else {
    *(anon_union_8_2_4d86d181_for_Span_4 *)object = local_10->field_4;
    (local_10->field_4).objects = object;
  }
  return;
}

Assistant:

void CentralFreeList::ReleaseToSpans(void* object) {
  const PageID p = reinterpret_cast<uintptr_t>(object) >> kPageShift;
  Span* span = Static::pageheap()->GetDescriptor(p);
  ASSERT(span != nullptr);
  ASSERT(span->refcount > 0);

  // If span is empty, move it to non-empty list
  if (span->objects == nullptr) {
    tcmalloc::DLL_Remove(span);
    tcmalloc::DLL_Prepend(&nonempty_, span);
  }

  // The following check is expensive, so it is disabled by default
  if (false) {
    // Check that object does not occur in list
    int got = 0;
    for (void* p = span->objects; p != nullptr; p = *((void**) p)) {
      ASSERT(p != object);
      got++;
    }
    (void)got;
    ASSERT(got + span->refcount ==
           (span->length<<kPageShift) /
           Static::sizemap()->ByteSizeForClass(span->sizeclass));
  }

  counter_++;
  span->refcount--;
  if (span->refcount == 0) {
    counter_ -= ((span->length<<kPageShift) /
                 Static::sizemap()->ByteSizeForClass(span->sizeclass));
    tcmalloc::DLL_Remove(span);
    --num_spans_;

    // Release central list lock while operating on pageheap
    lock_.Unlock();
    Static::pageheap()->Delete(span);
    lock_.Lock();
  } else {
    *(reinterpret_cast<void**>(object)) = span->objects;
    span->objects = object;
  }
}